

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O2

int google::SetVLOGLevel(char *module_pattern,int log_level)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  size_t patt_len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long *plVar5;
  size_type *psVar6;
  int local_38;
  
  local_38 = fLI::FLAGS_v;
  patt_len = strlen(module_pattern);
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)vmodule_lock);
  bVar4 = false;
  psVar6 = (size_type *)&vmodule_list;
  while (pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*psVar6,
        pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = std::operator==(pbVar1,module_pattern);
    if (bVar3) {
      if (!bVar4) {
        local_38 = *(int *)&pbVar1[1]._M_dataplus._M_p;
        bVar4 = true;
      }
      *(int *)&pbVar1[1]._M_dataplus._M_p = log_level;
    }
    else if ((!bVar4) &&
            (bVar3 = glog_internal_namespace_::SafeFNMatch_
                               ((pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length,module_pattern,
                                patt_len), bVar3)) {
      local_38 = *(int *)&pbVar1[1]._M_dataplus._M_p;
      bVar4 = true;
    }
    psVar6 = &pbVar1[1]._M_string_length;
  }
  if (!bVar4) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x30);
    (this->_M_dataplus)._M_p = (pointer)&this->field_2;
    this->_M_string_length = 0;
    (this->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (this,module_pattern);
    pbVar1 = vmodule_list;
    plVar5 = &cached_site_list;
    vmodule_list = this;
    *(int *)&this[1]._M_dataplus._M_p = log_level;
    this[1]._M_string_length = (size_type)pbVar1;
    while (puVar2 = (undefined8 *)*plVar5, puVar2 != (undefined8 *)0x0) {
      bVar4 = glog_internal_namespace_::SafeFNMatch_
                        (module_pattern,patt_len,(char *)puVar2[1],puVar2[2]);
      if (bVar4) {
        *puVar2 = this + 1;
        *plVar5 = puVar2[3];
      }
      else {
        plVar5 = puVar2 + 3;
      }
    }
  }
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)vmodule_lock);
  if (SetVLOGLevel::vlocal__.level == (int32 *)0x0) {
    bVar4 = InitVLOG3__(&SetVLOGLevel::vlocal__,&fLI::FLAGS_v,
                        "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/vlog_is_on.cc"
                        ,1);
    if (!bVar4) {
      return local_38;
    }
  }
  else if (*SetVLOGLevel::vlocal__.level < 1) {
    return local_38;
  }
  RawLog__(0,
           "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/vlog_is_on.cc"
           ,0xd6,"Set VLOG level for \"%s\" to %d",module_pattern,(ulong)(uint)log_level);
  return local_38;
}

Assistant:

int SetVLOGLevel(const char* module_pattern, int log_level) {
  int result = FLAGS_v;
  size_t const pattern_len = strlen(module_pattern);
  bool found = false;
  {
    MutexLock l(&vmodule_lock);  // protect whole read-modify-write
    for (const VModuleInfo* info = vmodule_list;
         info != NULL; info = info->next) {
      if (info->module_pattern == module_pattern) {
        if (!found) {
          result = info->vlog_level;
          found = true;
        }
        info->vlog_level = log_level;
      } else if (!found  &&
                 SafeFNMatch_(info->module_pattern.c_str(),
                              info->module_pattern.size(),
                              module_pattern, pattern_len)) {
        result = info->vlog_level;
        found = true;
      }
    }
    if (!found) {
      VModuleInfo* info = new VModuleInfo;
      info->module_pattern = module_pattern;
      info->vlog_level = log_level;
      info->next = vmodule_list;
      vmodule_list = info;

      SiteFlag** item_ptr = &cached_site_list;
      SiteFlag* item = cached_site_list;

      // We traverse the list fully because the pattern can match several items
      // from the list.
      while (item) {
        if (SafeFNMatch_(module_pattern, pattern_len, item->base_name,
                         item->base_len)) {
          // Redirect the cached value to its module override.
          item->level = &info->vlog_level;
          *item_ptr = item->next;  // Remove the item from the list.
        } else {
          item_ptr = &item->next;
        }
        item = *item_ptr;
      }
    }
  }
  RAW_VLOG(1, "Set VLOG level for \"%s\" to %d", module_pattern, log_level);
  return result;
}